

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform.cc
# Opt level: O2

bool __thiscall
sptk::FastFourierTransform::Run
          (FastFourierTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  pointer pdVar5;
  double *pdVar6;
  uint uVar7;
  uint uVar8;
  pointer pdVar9;
  pointer pdVar10;
  double *pdVar11;
  double *pdVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  size_type __new_size;
  pointer pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *__dest;
  uint uVar24;
  int iVar25;
  int li;
  double *pdVar26;
  double *pdVar27;
  bool bVar28;
  double dVar29;
  
  if (this->is_valid_ != true) {
    return false;
  }
  lVar14 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar14 >> 3 == (long)this->num_order_ + 1) {
    bVar28 = false;
    if (((imag_part_output != (vector<double,_std::allocator<double>_> *)0x0) &&
        (bVar28 = false, real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
       (bVar28 = false,
       (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == lVar14)) {
      __new_size = (size_type)this->fft_length_;
      if ((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(real_part_output,__new_size);
        __new_size = (size_type)this->fft_length_;
      }
      if ((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(imag_part_output,__new_size);
      }
      pdVar9 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      sVar17 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar9;
      pdVar20 = pdVar9;
      if (sVar17 != 0) {
        memmove(pdVar10,pdVar9,sVar17);
        pdVar10 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar9 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar20 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pdVar5 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar10 = (pointer)(((long)pdVar9 - (long)pdVar20) + (long)pdVar10); pdVar10 != pdVar5;
          pdVar10 = pdVar10 + 1) {
        *pdVar10 = 0.0;
      }
      pdVar10 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      __dest = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar17 = (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar10;
      pdVar9 = pdVar10;
      if (sVar17 != 0) {
        memmove(__dest,pdVar10,sVar17);
        __dest = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar10 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar9 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pdVar20 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (pdVar10 = (pointer)(((long)pdVar10 - (long)pdVar9) + (long)__dest); pdVar10 != pdVar20;
          pdVar10 = pdVar10 + 1) {
        *pdVar10 = 0.0;
      }
      pdVar6 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = this->fft_length_;
      pdVar12 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar16 = 1;
      uVar4 = this->half_fft_length_;
      uVar15 = uVar4;
      uVar24 = uVar8;
      while (uVar7 = uVar15, 1 < (int)uVar7) {
        uVar18 = (ulong)uVar7;
        pdVar11 = pdVar12 + (int)uVar8 / 4;
        pdVar21 = pdVar6;
        pdVar23 = __dest;
        pdVar22 = pdVar12;
        for (uVar19 = 0; pdVar26 = pdVar23, pdVar27 = pdVar21, uVar15 = uVar24, uVar19 != uVar18;
            uVar19 = uVar19 + 1) {
          for (; (int)uVar15 <= (int)uVar8; uVar15 = uVar15 + uVar24) {
            dVar29 = *pdVar27 - pdVar27[uVar18];
            dVar1 = *pdVar26;
            dVar2 = pdVar26[uVar18];
            *pdVar27 = *pdVar27 + pdVar27[uVar18];
            *pdVar26 = pdVar26[uVar18] + *pdVar26;
            pdVar27[uVar18] = *pdVar11 * dVar29 + *pdVar22 * (dVar1 - dVar2);
            pdVar26[uVar18] = (dVar1 - dVar2) * *pdVar11 - dVar29 * *pdVar22;
            pdVar26 = pdVar26 + (int)uVar24;
            pdVar27 = pdVar27 + (int)uVar24;
          }
          pdVar22 = pdVar22 + iVar16;
          pdVar11 = pdVar11 + iVar16;
          pdVar21 = pdVar21 + 1;
          pdVar23 = pdVar23 + 1;
        }
        iVar16 = iVar16 * 2;
        uVar24 = uVar7;
        uVar15 = uVar7 >> 1;
      }
      lVar14 = 0;
      uVar15 = 0;
      if (0 < (int)uVar4) {
        uVar15 = uVar4;
      }
      while (bVar28 = uVar15 != 0, uVar15 = uVar15 - 1, bVar28) {
        dVar1 = *(double *)((long)pdVar6 + lVar14);
        dVar2 = *(double *)((long)pdVar6 + lVar14 + 8);
        dVar29 = *(double *)((long)__dest + lVar14);
        dVar3 = *(double *)((long)__dest + lVar14 + 8);
        *(double *)((long)pdVar6 + lVar14) = dVar1 + dVar2;
        *(double *)((long)__dest + lVar14) =
             *(double *)((long)__dest + lVar14 + 8) + *(double *)((long)__dest + lVar14);
        *(double *)((long)pdVar6 + lVar14 + 8) = dVar1 - dVar2;
        *(double *)((long)__dest + lVar14 + 8) = dVar29 - dVar3;
        lVar14 = lVar14 + 0x10;
      }
      uVar15 = 1;
      if (1 < (int)uVar8) {
        uVar15 = uVar8;
      }
      iVar16 = 0;
      pdVar12 = pdVar6;
      pdVar22 = __dest;
      for (iVar13 = 0; iVar13 != uVar15 - 1; iVar13 = iVar13 + 1) {
        iVar25 = iVar13 - iVar16;
        uVar8 = uVar4;
        if (iVar25 < 0) {
          dVar1 = *pdVar12;
          dVar2 = *pdVar22;
          *pdVar12 = pdVar12[iVar25];
          *pdVar22 = pdVar22[iVar25];
          pdVar12[iVar25] = dVar1;
          pdVar22[iVar25] = dVar2;
        }
        for (; (int)uVar8 <= iVar16; uVar8 = (int)uVar8 / 2) {
          iVar16 = iVar16 - uVar8;
        }
        iVar16 = iVar16 + uVar8;
        pdVar12 = pdVar6 + iVar16;
        pdVar22 = __dest + iVar16;
      }
      bVar28 = true;
    }
  }
  else {
    bVar28 = false;
  }
  return bVar28;
}

Assistant:

bool FastFourierTransform::Run(const std::vector<double>& real_part_input,
                               const std::vector<double>& imag_part_input,
                               std::vector<double>* real_part_output,
                               std::vector<double>* imag_part_output) const {
  // Check inputs.
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(num_order_ + 1) ||
      imag_part_input.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == real_part_output || NULL == imag_part_output) {
    return false;
  }

  // Prepare memories.
  if (real_part_output->size() != static_cast<std::size_t>(fft_length_)) {
    real_part_output->resize(fft_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(fft_length_)) {
    imag_part_output->resize(fft_length_);
  }

  // Copy inputs and fill zero.
  std::copy(real_part_input.begin(), real_part_input.end(),
            real_part_output->begin());
  std::fill(real_part_output->begin() + real_part_input.size(),
            real_part_output->end(), 0.0);
  std::copy(imag_part_input.begin(), imag_part_input.end(),
            imag_part_output->begin());
  std::fill(imag_part_output->begin() + imag_part_input.size(),
            imag_part_output->end(), 0.0);

  double* x(&((*real_part_output)[0]));
  double* y(&((*imag_part_output)[0]));

  {
    int lix(fft_length_);
    int lmx(half_fft_length_);
    int lf(1);
    while (1 < lmx) {
      const double* sinp(&(sine_table_[0]));
      const double* cosp(&(sine_table_[0]) + fft_length_ / 4);
      for (int i(0); i < lmx; ++i) {
        double* xpi(&(x[i]));
        double* ypi(&(y[i]));
        for (int li(lix); li <= fft_length_; li += lix) {
          const double t1(*(xpi) - *(xpi + lmx));
          const double t2(*(ypi) - *(ypi + lmx));
          *(xpi) += *(xpi + lmx);
          *(ypi) += *(ypi + lmx);
          *(xpi + lmx) = *cosp * t1 + *sinp * t2;
          *(ypi + lmx) = *cosp * t2 - *sinp * t1;
          xpi += lix;
          ypi += lix;
        }
        sinp += lf;
        cosp += lf;
      }
      lix = lmx;
      lmx /= 2;
      lf *= 2;
    }
  }

  {
    double* xp(x);
    double* yp(y);
    for (int li(0); li < half_fft_length_; ++li) {
      const double t1(*(xp) - *(xp + 1));
      const double t2(*(yp) - *(yp + 1));
      *(xp) += *(xp + 1);
      *(yp) += *(yp + 1);
      *(xp + 1) = t1;
      *(yp + 1) = t2;
      xp += 2;
      yp += 2;
    }
  }

  // Bit reversal.
  {
    double* xp(x);
    double* yp(y);
    const int dec_fft_length(fft_length_ - 1);
    for (int lmx(0), j(0); lmx < dec_fft_length; ++lmx) {
      const int lmxj(lmx - j);
      if (lmxj < 0) {
        const double t1(*(xp));
        const double t2(*(yp));
        *(xp) = *(xp + lmxj);
        *(yp) = *(yp + lmxj);
        *(xp + lmxj) = t1;
        *(yp + lmxj) = t2;
      }

      int li(half_fft_length_);
      while (li <= j) {
        j -= li;
        li /= 2;
      }
      j += li;
      xp = x + j;
      yp = y + j;
    }
  }

  return true;
}